

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

BigInt * __thiscall BigInt::simple_multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  int iVar1;
  BigInt *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  bool local_101;
  allocator local_d9;
  string local_d8 [39];
  undefined1 local_b1;
  value_type_conflict1 local_b0;
  int local_ac;
  int local_a8;
  int j;
  int i;
  int carry;
  undefined1 local_98 [2];
  bool positive;
  vector<int,_std::allocator<int>_> temp;
  int len_b;
  int len_a;
  BigInt local_40;
  BigInt *local_20;
  BigInt *b_local;
  BigInt *this_local;
  BigInt *ans;
  
  local_20 = b;
  b_local = this;
  this_local = __return_storage_ptr__;
  BigInt(&local_40,0);
  bVar2 = operator==(this,&local_40);
  this_00 = local_20;
  local_101 = true;
  if (!bVar2) {
    BigInt((BigInt *)&len_a,0);
    local_101 = operator==(this_00,(BigInt *)&len_a);
    ~BigInt((BigInt *)&len_a);
  }
  ~BigInt(&local_40);
  if (local_101 == false) {
    iVar4 = get_real_length(this);
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = get_real_length(local_20);
    iVar5 = iVar4 + temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    carry = 0;
    std::allocator<int>::allocator((allocator<int> *)((long)&i + 3));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,(long)iVar5,&carry,
               (allocator<int> *)((long)&i + 3));
    std::allocator<int>::~allocator((allocator<int> *)((long)&i + 3));
    bVar2 = get_positive_sign(this);
    bVar3 = get_positive_sign(local_20);
    i._2_1_ = -(bVar2 == bVar3) & 1;
    j = 0;
    for (local_a8 = 1; local_a8 <= iVar4; local_a8 = local_a8 + 1) {
      for (local_ac = 1;
          local_ac <=
          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_; local_ac = local_ac + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->value,(long)local_a8);
        iVar5 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->value,(long)local_ac)
        ;
        iVar1 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_98,
                            (long)(local_a8 + local_ac + -1));
        *pvVar6 = iVar5 * iVar1 + *pvVar6;
      }
    }
    local_ac = 0;
    for (local_a8 = 1;
        local_a8 <
        iVar4 + temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_ || j != 0; local_a8 = local_a8 + 1) {
      uVar7 = (ulong)local_a8;
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_98);
      if (sVar8 <= uVar7) {
        local_b0 = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_98,&local_b0);
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_98,(long)local_a8);
      local_ac = *pvVar6 + j;
      iVar5 = local_ac % 10;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_98,(long)local_a8);
      *pvVar6 = iVar5;
      j = local_ac / 10;
    }
    local_b1 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"0",&local_d9);
    BigInt(__return_storage_ptr__,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->value,(vector<int,_std::allocator<int>_> *)local_98);
    get_real_length(__return_storage_ptr__);
    set_sign(__return_storage_ptr__,(bool)(i._2_1_ & 1));
    local_b1 = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  else {
    BigInt(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::simple_multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    int len_a = this->get_real_length();
    int len_b = b.get_real_length();
    vector<int> temp(len_a + len_b, 0);
    bool positive = this->get_positive_sign() == b.get_positive_sign() ? true : false;
    int carry = 0;
    int i, j;
    for (i = 1; i <= len_a; ++i) { // not carry first
        for (j = 1; j <= len_b; ++j) {
            temp[i + j - 1] += this->value[i] * b.value[j];
        }
    }
    i = 1;
    j = 0;
    while (i < (len_a + len_b) || carry != 0) { // calculate carry
        if (i >= temp.size()) {
            temp.push_back(0);
        }
        j = temp[i] + carry;
        temp[i] = j % 10;
        carry = j / 10;
        ++i;
    }
    BigInt ans("0");
    ans.value = temp;
    ans.get_real_length();
    ans.set_sign(positive);
    return ans;
}